

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O0

pair<bool,_bool> __thiscall
spvtools::opt::UpgradeMemoryModel::CheckType
          (UpgradeMemoryModel *this,uint32_t type_id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  bool bVar1;
  pair<bool,_bool> pVar2;
  Op OVar3;
  uint32_t uVar4;
  int32_t iVar5;
  IRContext *pIVar6;
  DefUseManager *pDVar7;
  size_type sVar8;
  const_reference pvVar9;
  tuple<bool&,bool&> local_70 [20];
  pair<bool,_bool> local_5c;
  byte local_5a;
  bool local_59;
  bool remaining_volatile;
  uint64_t uStack_58;
  bool remaining_coherent;
  uint64_t value;
  Instruction *index_inst;
  uint32_t index;
  int i;
  Instruction *element_inst;
  Instruction *type_inst;
  bool is_volatile;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_28;
  bool is_coherent;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indices_local;
  UpgradeMemoryModel *pUStack_18;
  uint32_t type_id_local;
  UpgradeMemoryModel *this_local;
  
  type_inst._7_1_ = 0;
  type_inst._6_1_ = 0;
  pvStack_28 = indices;
  indices_local._4_4_ = type_id;
  pUStack_18 = this;
  pIVar6 = Pass::context(&this->super_Pass);
  pDVar7 = IRContext::get_def_use_mgr(pIVar6);
  element_inst = analysis::DefUseManager::GetDef(pDVar7,indices_local._4_4_);
  OVar3 = opt::Instruction::opcode(element_inst);
  if (OVar3 != OpTypePointer) {
    __assert_fail("type_inst->opcode() == spv::Op::OpTypePointer",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/upgrade_memory_model.cpp"
                  ,0x19b,
                  "std::pair<bool, bool> spvtools::opt::UpgradeMemoryModel::CheckType(uint32_t, const std::vector<uint32_t> &)"
                 );
  }
  pIVar6 = Pass::context(&this->super_Pass);
  pDVar7 = IRContext::get_def_use_mgr(pIVar6);
  uVar4 = opt::Instruction::GetSingleWordInOperand(element_inst,1);
  _index = analysis::DefUseManager::GetDef(pDVar7,uVar4);
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvStack_28);
  index_inst._4_4_ = (int)sVar8;
  while ((index_inst._4_4_ = index_inst._4_4_ + -1, -1 < index_inst._4_4_ &&
         (((type_inst._7_1_ & 1) == 0 || ((type_inst._6_1_ & 1) == 0))))) {
    OVar3 = opt::Instruction::opcode(_index);
    if (OVar3 == OpTypePointer) {
      pIVar6 = Pass::context(&this->super_Pass);
      pDVar7 = IRContext::get_def_use_mgr(pIVar6);
      uVar4 = opt::Instruction::GetSingleWordInOperand(_index,1);
      _index = analysis::DefUseManager::GetDef(pDVar7,uVar4);
    }
    else {
      OVar3 = opt::Instruction::opcode(_index);
      if (OVar3 == OpTypeStruct) {
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           (pvStack_28,(long)index_inst._4_4_);
        index_inst._0_4_ = *pvVar9;
        pIVar6 = Pass::context(&this->super_Pass);
        pDVar7 = IRContext::get_def_use_mgr(pIVar6);
        value = (uint64_t)analysis::DefUseManager::GetDef(pDVar7,(value_type)index_inst);
        OVar3 = opt::Instruction::opcode((Instruction *)value);
        if (OVar3 != OpConstant) {
          __assert_fail("index_inst->opcode() == spv::Op::OpConstant",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/upgrade_memory_model.cpp"
                        ,0x1a7,
                        "std::pair<bool, bool> spvtools::opt::UpgradeMemoryModel::CheckType(uint32_t, const std::vector<uint32_t> &)"
                       );
        }
        uStack_58 = GetIndexValue(this,(Instruction *)value);
        bVar1 = HasDecoration(this,_index,(uint32_t)uStack_58,Coherent);
        type_inst._7_1_ = (type_inst._7_1_ & 1) != 0 || bVar1;
        bVar1 = HasDecoration(this,_index,(uint32_t)uStack_58,DecorationVolatile);
        type_inst._6_1_ = (type_inst._6_1_ & 1) != 0 || bVar1;
        pIVar6 = Pass::context(&this->super_Pass);
        pDVar7 = IRContext::get_def_use_mgr(pIVar6);
        uVar4 = opt::Instruction::GetSingleWordInOperand(_index,(uint32_t)uStack_58);
        _index = analysis::DefUseManager::GetDef(pDVar7,uVar4);
      }
      else {
        OVar3 = opt::Instruction::opcode(_index);
        iVar5 = spvOpcodeIsComposite(OVar3);
        if (iVar5 == 0) {
          __assert_fail("spvOpcodeIsComposite(element_inst->opcode())",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/upgrade_memory_model.cpp"
                        ,0x1b0,
                        "std::pair<bool, bool> spvtools::opt::UpgradeMemoryModel::CheckType(uint32_t, const std::vector<uint32_t> &)"
                       );
        }
        pIVar6 = Pass::context(&this->super_Pass);
        pDVar7 = IRContext::get_def_use_mgr(pIVar6);
        uVar4 = opt::Instruction::GetSingleWordInOperand(_index,0);
        _index = analysis::DefUseManager::GetDef(pDVar7,uVar4);
      }
    }
  }
  if (((type_inst._7_1_ & 1) == 0) || ((type_inst._6_1_ & 1) == 0)) {
    local_59 = false;
    local_5a = 0;
    local_5c = CheckAllTypes(this,_index);
    std::tie<bool,bool>((bool *)local_70,&local_59);
    std::tuple<bool&,bool&>::operator=(local_70,&local_5c);
    type_inst._7_1_ = (type_inst._7_1_ & 1) != 0 || (local_59 & 1U) != 0;
    type_inst._6_1_ = (type_inst._6_1_ & 1) != 0 || (local_5a & 1) != 0;
  }
  pVar2 = std::make_pair<bool&,bool&>((bool *)((long)&type_inst + 7),(bool *)((long)&type_inst + 6))
  ;
  return pVar2;
}

Assistant:

std::pair<bool, bool> UpgradeMemoryModel::CheckType(
    uint32_t type_id, const std::vector<uint32_t>& indices) {
  bool is_coherent = false;
  bool is_volatile = false;
  Instruction* type_inst = context()->get_def_use_mgr()->GetDef(type_id);
  assert(type_inst->opcode() == spv::Op::OpTypePointer);
  Instruction* element_inst = context()->get_def_use_mgr()->GetDef(
      type_inst->GetSingleWordInOperand(1u));
  for (int i = (int)indices.size() - 1; i >= 0; --i) {
    if (is_coherent && is_volatile) break;

    if (element_inst->opcode() == spv::Op::OpTypePointer) {
      element_inst = context()->get_def_use_mgr()->GetDef(
          element_inst->GetSingleWordInOperand(1u));
    } else if (element_inst->opcode() == spv::Op::OpTypeStruct) {
      uint32_t index = indices.at(i);
      Instruction* index_inst = context()->get_def_use_mgr()->GetDef(index);
      assert(index_inst->opcode() == spv::Op::OpConstant);
      uint64_t value = GetIndexValue(index_inst);
      is_coherent |= HasDecoration(element_inst, static_cast<uint32_t>(value),
                                   spv::Decoration::Coherent);
      is_volatile |= HasDecoration(element_inst, static_cast<uint32_t>(value),
                                   spv::Decoration::Volatile);
      element_inst = context()->get_def_use_mgr()->GetDef(
          element_inst->GetSingleWordInOperand(static_cast<uint32_t>(value)));
    } else {
      assert(spvOpcodeIsComposite(element_inst->opcode()));
      element_inst = context()->get_def_use_mgr()->GetDef(
          element_inst->GetSingleWordInOperand(0u));
    }
  }

  if (!is_coherent || !is_volatile) {
    bool remaining_coherent = false;
    bool remaining_volatile = false;
    std::tie(remaining_coherent, remaining_volatile) =
        CheckAllTypes(element_inst);
    is_coherent |= remaining_coherent;
    is_volatile |= remaining_volatile;
  }

  return std::make_pair(is_coherent, is_volatile);
}